

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

int * __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::VarUsageRef(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *this,int i)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  int in_ESI;
  long in_RDI;
  double dVar6;
  undefined1 auVar7 [16];
  ulong local_20;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar2 = (ulong)in_ESI;
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb18));
  if (sVar3 <= uVar2) {
    iVar1 = num_vars((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)0x4829c5);
    sVar3 = (size_type)iVar1;
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb18));
    auVar7._8_4_ = (int)(sVar4 >> 0x20);
    auVar7._0_8_ = sVar4;
    auVar7._12_4_ = 0x45300000;
    dVar6 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) * 1.4;
    local_20 = (ulong)dVar6;
    local_20 = local_20 | (long)(dVar6 - 9.223372036854776e+18) & (long)local_20 >> 0x3f;
    std::max<unsigned_long>((unsigned_long *)&stack0xffffffffffffffe8,&local_20);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),sVar3
              );
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xb18),(long)in_ESI);
  return pvVar5;
}

Assistant:

int& VarUsageRef(int i) {
		assert(i>=0 && i<num_vars());
		if ((size_t)i>=refcnt_vars_.size())
			refcnt_vars_.resize(
						std::max((size_t)num_vars(),
										 (size_t)(refcnt_vars_.size()*1.4)));
		return refcnt_vars_[i];
	}